

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O1

void __thiscall tt::Thread::start(Thread *this)

{
  int iVar1;
  _Any_data *this_00;
  void *__stat_loc;
  _Any_data local_48;
  code *local_38;
  
  if (this->m_started == true) {
    __assert_fail("!m_started",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/base/Thread.cc"
                  ,0x8a,"void tt::Thread::start()");
  }
  this->m_started = true;
  this_00 = (_Any_data *)operator_new(0x50);
  std::function<void_()>::function((function<void_()> *)&local_48,&this->m_func);
  detail::ThreadData::ThreadData
            ((ThreadData *)this_00,(m_ThreadFunc *)&local_48,&this->m_name,&this->m_tid,
             &this->m_latch);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  __stat_loc = (void *)0x0;
  iVar1 = pthread_create(&this->m_pthreadId,(pthread_attr_t *)0x0,detail::startThread,this_00);
  if (iVar1 == 0) {
    CountDownLatch::wait(&this->m_latch,__stat_loc);
    if (this->m_tid < 1) {
      __assert_fail("m_tid>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/base/Thread.cc"
                    ,0x94,"void tt::Thread::start()");
    }
  }
  else {
    this->m_started = false;
    if (*(char **)(this_00->_M_pod_data + 0x20) != this_00->_M_pod_data + 0x30) {
      operator_delete(*(char **)(this_00->_M_pod_data + 0x20));
    }
    if (*(code **)(this_00 + 1) != (code *)0x0) {
      (**(code **)(this_00 + 1))(this_00,this_00,__destroy_functor);
    }
    operator_delete(this_00);
  }
  return;
}

Assistant:

void Thread::start(){
	assert(!m_started);
	m_started = true;

	detail::ThreadData* data = new detail::ThreadData(m_func,m_name,&m_tid,&m_latch);
	
	if(pthread_create(&m_pthreadId,NULL,&detail::startThread,data)){
		m_started = false;
		delete data;
	}else{
		m_latch.wait();
		assert(m_tid>0);
	}

}